

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

void __thiscall CustomLayer::write_param(CustomLayer *this,FILE *pp)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint id;
  long lVar5;
  long lVar6;
  ParamDict *this_00;
  float fVar7;
  Mat local_d8;
  ParamDict *local_90;
  Mat local_88;
  undefined8 local_38;
  
  this_00 = &this->mpd;
  id = 0;
  local_90 = this_00;
  do {
    iVar3 = ncnn::ParamDict::type(this_00,id);
    switch(iVar3) {
    case 2:
      uVar4 = ncnn::ParamDict::get(this_00,id,0);
      fprintf((FILE *)pp," %d=%d",(ulong)id,(ulong)uVar4);
      break;
    case 3:
      fVar7 = ncnn::ParamDict::get(this_00,id,0.0);
      fprintf((FILE *)pp," %d=%e",SUB84((double)fVar7,0),(ulong)id);
      break;
    case 5:
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8._20_8_ = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_38 = CONCAT44(extraout_var,iVar3);
      ncnn::ParamDict::get(&local_88,this_00,id,&local_d8);
      piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8._20_8_ = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      lVar6 = (long)local_88.w;
      fprintf((FILE *)pp," %d=%d",(ulong)(-id - 0x5b04),(ulong)(uint)local_88.w);
      pvVar2 = local_88.data;
      if (0 < lVar6) {
        lVar5 = 0;
        do {
          fprintf((FILE *)pp,",%d",(ulong)*(uint *)((long)pvVar2 + lVar5 * 4));
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
      this_00 = local_90;
      piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      if ((int)local_38 == 6) goto switchD_0016edcc_caseD_6;
      break;
    case 6:
switchD_0016edcc_caseD_6:
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8._20_8_ = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      ncnn::ParamDict::get(&local_88,this_00,id,&local_d8);
      piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8._20_8_ = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      lVar6 = (long)local_88.w;
      fprintf((FILE *)pp," %d=%d",(ulong)(-id - 0x5b04),(ulong)(uint)local_88.w);
      pvVar2 = local_88.data;
      if (0 < lVar6) {
        lVar5 = 0;
        do {
          fprintf((FILE *)pp,",%e",SUB84((double)*(float *)((long)pvVar2 + lVar5 * 4),0));
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
      this_00 = local_90;
      piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
    }
    id = id + 1;
    if (id == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

void write_param(FILE* pp)
    {
        for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
        {
            int type = mpd.type(i);
            if (type == 0)
                continue;

            if (type == 2)
            {
                fprintf(pp, " %d=%d", i, mpd.get(i, 0));
            }
            if (type == 3)
            {
                fprintf(pp, " %d=%e", i, mpd.get(i, 0.f));
            }
            if (type == 5)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const int* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%d", p[j]);
                }
            }
            if (type == 6)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const float* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%e", p[j]);
                }
            }
        }
    }